

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR parse_type_pattern(lysp_yang_ctx *ctx,lysp_restr **patterns)

{
  long *plVar1;
  lysp_ext_instance **pplVar2;
  lysp_restr *plVar3;
  long lVar4;
  lyd_node *plVar5;
  size_t sVar6;
  LY_ERR LVar7;
  long *plVar8;
  char *pcVar9;
  lysp_ext_instance **pplVar10;
  char *format;
  ly_stmt parent_stmt;
  uint16_t *flags;
  ly_ctx *plVar11;
  lysp_ext_instance *plVar12;
  lysp_ext_instance *plVar13;
  bool bVar14;
  ly_stmt kw;
  char *buf;
  size_t word_len;
  char *word;
  lysp_ext_instance **in_stack_ffffffffffffff80;
  ly_stmt local_74;
  char *local_70;
  size_t local_68;
  char *local_60;
  lysp_ext_instance **local_58;
  lysp_ext_instance **local_50;
  lysp_ext_instance **local_48;
  lysp_ext_instance **local_40;
  lysp_ext_instance **local_38;
  
  plVar3 = *patterns;
  if (plVar3 == (lysp_restr *)0x0) {
    plVar8 = (long *)malloc(0x48);
    if (plVar8 == (long *)0x0) goto LAB_00182b90;
    *plVar8 = 1;
  }
  else {
    plVar12 = (lysp_ext_instance *)((long)&(plVar3[-1].exts)->name + 1);
    plVar3[-1].exts = plVar12;
    plVar8 = (long *)realloc(&plVar3[-1].exts,(long)plVar12 * 0x40 | 8);
    if (plVar8 == (long *)0x0) {
      (*patterns)[-1].exts = (lysp_ext_instance *)((long)&(*patterns)[-1].exts[-1].exts + 7);
      goto LAB_00182b90;
    }
  }
  *patterns = (lysp_restr *)(plVar8 + 1);
  lVar4 = *plVar8;
  plVar1 = plVar8 + lVar4 * 8;
  flags = (uint16_t *)(plVar1 + -5);
  plVar1[-1] = 0;
  *plVar1 = 0;
  plVar1[-3] = 0;
  plVar1[-2] = 0;
  flags[0] = 0;
  flags[1] = 0;
  flags[2] = 0;
  flags[3] = 0;
  plVar1[-4] = 0;
  plVar1[-7] = 0;
  plVar1[-6] = 0;
  LVar7 = get_argument(ctx,Y_STR_ARG,flags,&local_60,&local_70,&local_68);
  if (LVar7 != LY_SUCCESS) {
    return LVar7 + (LVar7 == LY_SUCCESS);
  }
  if (local_70 == (char *)0x0) {
    local_70 = (char *)malloc(local_68 + 2);
  }
  else {
    local_70 = (char *)ly_realloc(local_70,local_68 + 2);
    local_60 = local_70;
  }
  sVar6 = local_68;
  if (local_70 != (char *)0x0) {
    if (local_68 != 0) {
      memmove(local_70 + 1,local_60,local_68);
    }
    plVar12 = (lysp_ext_instance *)(plVar8 + lVar4 * 8 + -7);
    *local_70 = '\x06';
    local_70[sVar6 + 1] = '\0';
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar11 = (ly_ctx *)0x0;
    }
    else {
      plVar11 = (ly_ctx *)
                **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar7 = lydict_insert_zc(plVar11,local_70,(char **)plVar12);
    if (LVar7 != LY_SUCCESS) {
      return LVar7;
    }
    pplVar2 = (lysp_ext_instance **)(plVar8 + lVar4 * 8);
    pplVar2[-6] = (lysp_ext_instance *)
                  (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    LVar7 = get_keyword(ctx,&local_74,&local_60,&local_68);
    if (LVar7 != LY_SUCCESS) {
      return LVar7;
    }
    if (local_74 == LY_STMT_SYNTAX_SEMICOLON) {
      bVar14 = true;
    }
    else {
      if (local_74 != LY_STMT_SYNTAX_LEFT_BRACE) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar11 = (ly_ctx *)0x0;
        }
        else {
          plVar11 = (ly_ctx *)
                    **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1]
          ;
        }
        pcVar9 = lyplg_ext_stmt2str(local_74);
        ly_vlog(plVar11,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar9);
        return LY_EVALID;
      }
      LVar7 = get_keyword(ctx,&local_74,&local_60,&local_68);
      if (LVar7 != LY_SUCCESS) {
        return LVar7;
      }
      bVar14 = local_74 == LY_STMT_SYNTAX_RIGHT_BRACE;
    }
    if (bVar14) {
      return LY_SUCCESS;
    }
    local_38 = pplVar2 + -4;
    local_40 = pplVar2 + -3;
    local_48 = pplVar2 + -1;
    local_50 = pplVar2 + -2;
    local_58 = pplVar2;
    do {
      if ((int)local_74 < 0xf0000) {
        if (local_74 == LY_STMT_DESCRIPTION) {
          plVar13 = *local_50;
          parent_stmt = LY_STMT_DESCRIPTION;
          pplVar10 = local_50;
        }
        else {
          plVar13 = plVar12;
          if (local_74 == LY_STMT_ERROR_APP_TAG) {
            parent_stmt = LY_STMT_ERROR_APP_TAG;
            pplVar10 = local_40;
          }
          else {
            if (local_74 != LY_STMT_ERROR_MESSAGE) {
LAB_00182e8d:
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar11 = (ly_ctx *)0x0;
              }
              else {
                plVar11 = (ly_ctx *)
                          **(undefined8 **)
                            (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar9 = lyplg_ext_stmt2str(local_74);
              format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_00182efa:
              ly_vlog(plVar11,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar9,"pattern");
              return LY_EVALID;
            }
            parent_stmt = LY_STMT_ERROR_MESSAGE;
            pplVar10 = local_38;
          }
        }
LAB_00182d9d:
        LVar7 = parse_text_field(ctx,plVar13,parent_stmt,(uint32_t)pplVar10,(char **)0x2,
                                 Y_IDENTIF_ARG,(uint16_t *)local_58,in_stack_ffffffffffffff80);
      }
      else if (local_74 == LY_STMT_EXTENSION_INSTANCE) {
        LVar7 = parse_ext(ctx,local_60,local_68,plVar12,LY_STMT_PATTERN,0,local_58);
      }
      else {
        if (local_74 != LY_STMT_MODIFIER) {
          if (local_74 != LY_STMT_REFERENCE) goto LAB_00182e8d;
          plVar13 = *local_48;
          parent_stmt = LY_STMT_REFERENCE;
          pplVar10 = local_48;
          goto LAB_00182d9d;
        }
        plVar5 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        if (*(byte *)&plVar5[2].schema < 2) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar11 = (ly_ctx *)0x0;
          }
          else {
            plVar11 = (ly_ctx *)**(undefined8 **)plVar5;
          }
          format = 
          "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
          ;
          pcVar9 = "modifier";
          goto LAB_00182efa;
        }
        LVar7 = parse_type_pattern_modifier(ctx,(lysp_restr *)plVar12);
      }
      if (LVar7 != LY_SUCCESS) {
        return LVar7;
      }
      LVar7 = get_keyword(ctx,&local_74,&local_60,&local_68);
      if (LVar7 != LY_SUCCESS) {
        return LVar7;
      }
      if (local_74 == LY_STMT_SYNTAX_RIGHT_BRACE) {
        bVar14 = true;
        if ((*pplVar2 != (lysp_ext_instance *)0x0) &&
           (LVar7 = ly_set_add(&ctx->main_ctx->ext_inst,*pplVar2,'\x01',(uint32_t *)0x0),
           LVar7 != LY_SUCCESS)) {
          return LVar7;
        }
      }
      if (bVar14) {
        return LY_SUCCESS;
      }
    } while( true );
  }
LAB_00182b90:
  if (ctx == (lysp_yang_ctx *)0x0) {
    plVar11 = (ly_ctx *)0x0;
  }
  else {
    plVar11 = (ly_ctx *)
              **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  ly_log(plVar11,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_type_pattern");
  return LY_EMEM;
}

Assistant:

static LY_ERR
parse_type_pattern(struct lysp_yang_ctx *ctx, struct lysp_restr **patterns)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_restr *restr;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *patterns, restr, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, &restr->arg.flags, &word, &buf, &word_len));

    /* add special meaning first byte */
    if (buf) {
        buf = ly_realloc(buf, word_len + 2);
        word = buf;
    } else {
        buf = malloc(word_len + 2);
    }
    LY_CHECK_ERR_RET(!buf, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);
    if (word_len) {
        memmove(buf + 1, word, word_len);
    }
    buf[0] = LYSP_RESTR_PATTERN_ACK; /* pattern's default regular-match flag */
    buf[word_len + 1] = '\0'; /* terminating NULL byte */
    LY_CHECK_RET(lydict_insert_zc(PARSER_CTX(ctx), buf, &restr->arg.str));
    restr->arg.mod = PARSER_CUR_PMOD(ctx);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, restr->dsc, LY_STMT_DESCRIPTION, 0, &restr->dsc, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, restr->ref, LY_STMT_REFERENCE, 0, &restr->ref, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_ERROR_APP_TAG:
            LY_CHECK_RET(parse_text_field(ctx, restr, LY_STMT_ERROR_APP_TAG, 0, &restr->eapptag, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_ERROR_MESSAGE:
            LY_CHECK_RET(parse_text_field(ctx, restr, LY_STMT_ERROR_MESSAGE, 0, &restr->emsg, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_MODIFIER:
            PARSER_CHECK_STMTVER2_RET(ctx, "modifier", "pattern");
            LY_CHECK_RET(parse_type_pattern_modifier(ctx, restr));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, restr, LY_STMT_PATTERN, 0, &restr->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "pattern");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, restr->exts, ret, cleanup);
    }

cleanup:
    return ret;
}